

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O1

TestResult *
JsonTest::checkStringEqual
          (TestResult *result,string *expected,string *actual,char *file,uint line,char *expr)

{
  size_t __n;
  int iVar1;
  TestResult *pTVar2;
  
  __n = expected->_M_string_length;
  if (__n == actual->_M_string_length) {
    if (__n == 0) {
      return result;
    }
    iVar1 = bcmp((expected->_M_dataplus)._M_p,(actual->_M_dataplus)._M_p,__n);
    if (iVar1 == 0) {
      return result;
    }
  }
  TestResult::addFailure(result,file,line,expr);
  pTVar2 = TestResult::operator<<(result,(char (*) [12])"Expected: \'");
  pTVar2 = TestResult::operator<<(pTVar2,expected);
  TestResult::operator<<(pTVar2,(char (*) [3])0x14ca55);
  pTVar2 = TestResult::operator<<(result,(char (*) [12])"Actual  : \'");
  pTVar2 = TestResult::operator<<(pTVar2,actual);
  TestResult::operator<<(pTVar2,(char (*) [2])0x1482c8);
  return result;
}

Assistant:

TestResult& checkStringEqual(TestResult& result,
                             const std::string& expected,
                             const std::string& actual,
                             const char* file,
                             unsigned int line,
                             const char* expr) {
  if (expected != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: '" << expected << "'\n";
    result << "Actual  : '" << actual << "'";
  }
  return result;
}